

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O0

void __thiscall duckdb::CreateInfo::Serialize(CreateInfo *this,Serializer *serializer)

{
  bool bVar1;
  LogicalDependencyList *default_value;
  _Elt_pointer in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  Serializer *in_stack_fffffffffffffec0;
  Value *in_stack_fffffffffffffec8;
  LogicalDependencyList *value;
  Serializer *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  field_id_t fVar2;
  Serializer *in_stack_fffffffffffffee0;
  Serializer *this_00;
  LogicalDependencyList local_f8;
  _func_int **local_b8;
  bool bStack_b0;
  bool bStack_af;
  undefined6 uStack_ae;
  _Alloc_hider local_a8;
  undefined7 uStack_a7;
  size_type sStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  idx_t local_88;
  _Elt_pointer local_10;
  
  fVar2 = (field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30);
  local_10 = in_RSI;
  Serializer::WriteProperty<duckdb::CatalogType>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,(CatalogType *)in_stack_fffffffffffffeb8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8);
  Serializer::WriteProperty<duckdb::OnCreateConflict>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,(OnCreateConflict *)in_stack_fffffffffffffeb8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffed0,(field_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffee0,(LogicalTypeId)(fVar2 >> 8));
  Value::Value((Value *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_);
  Serializer::WritePropertyWithDefault<duckdb::Value>
            (in_stack_fffffffffffffee0,fVar2,(char *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(Value *)in_stack_fffffffffffffec0);
  Value::~Value((Value *)in_stack_fffffffffffffec0);
  LogicalType::~LogicalType((LogicalType *)0xacc7e4);
  fVar2 = (field_id_t)((ulong)(in_RDI + 0xf0) >> 0x30);
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = (_Alloc_hider)0x0;
  uStack_a7 = 0;
  sStack_a0 = 0;
  local_b8 = (_func_int **)0x0;
  bStack_b0 = false;
  bStack_af = false;
  uStack_ae = 0;
  local_88 = 0;
  this_00 = (Serializer *)&stack0xffffffffffffff48;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0xacc83a);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (this_00,fVar2,(char *)local_10,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffec8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffec0);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0xacc869);
  bVar1 = Serializer::ShouldSerialize(in_stack_fffffffffffffec0,(idx_t)in_stack_fffffffffffffeb8);
  if (bVar1) {
    default_value = (LogicalDependencyList *)(in_RDI + 0x78);
    local_f8.set._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_f8.set._M_h._M_rehash_policy._4_4_ = 0;
    local_f8.set._M_h._M_rehash_policy._M_next_resize = 0;
    local_f8.set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_f8.set._M_h._M_element_count = 0;
    local_f8.set._M_h._M_buckets = (__buckets_ptr)0x0;
    local_f8.set._M_h._M_bucket_count = 0;
    local_f8.set._M_h._M_single_bucket = (__node_base_ptr)0x0;
    value = &local_f8;
    LogicalDependencyList::LogicalDependencyList((LogicalDependencyList *)0xacc8cb);
    Serializer::WritePropertyWithDefault<duckdb::LogicalDependencyList>
              (this_00,fVar2,(char *)local_10,value,default_value);
    LogicalDependencyList::~LogicalDependencyList((LogicalDependencyList *)0xacc8f6);
  }
  return;
}

Assistant:

void CreateInfo::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<CatalogType>(100, "type", type);
	serializer.WritePropertyWithDefault<string>(101, "catalog", catalog);
	serializer.WritePropertyWithDefault<string>(102, "schema", schema);
	serializer.WritePropertyWithDefault<bool>(103, "temporary", temporary);
	serializer.WritePropertyWithDefault<bool>(104, "internal", internal);
	serializer.WriteProperty<OnCreateConflict>(105, "on_conflict", on_conflict);
	serializer.WritePropertyWithDefault<string>(106, "sql", sql);
	serializer.WritePropertyWithDefault<Value>(107, "comment", comment, Value());
	serializer.WritePropertyWithDefault<unordered_map<string, string>>(108, "tags", tags, unordered_map<string, string>());
	if (serializer.ShouldSerialize(2)) {
		serializer.WritePropertyWithDefault<LogicalDependencyList>(109, "dependencies", dependencies, LogicalDependencyList());
	}
}